

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_ManFree(Dtt_Man_t *p)

{
  Dtt_Man_t *p_local;
  
  Vec_IntFreeP(&p->vVisited);
  if (p->pTable != (uint *)0x0) {
    free(p->pTable);
    p->pTable = (uint *)0x0;
  }
  if (p->pNodes != (int *)0x0) {
    free(p->pNodes);
    p->pNodes = (int *)0x0;
  }
  if (p->pTimes != (int *)0x0) {
    free(p->pTimes);
    p->pTimes = (int *)0x0;
  }
  if (p->pVisited != (char *)0x0) {
    free(p->pVisited);
    p->pVisited = (char *)0x0;
  }
  Vec_IntFreeP(&p->vFanins);
  Vec_IntFreeP(&p->vTruths);
  Vec_IntFreeP(&p->vConfigs);
  Vec_IntFreeP(&p->vClasses);
  Vec_IntFreeP(&p->vTruthNpns);
  Vec_WecFreeP(&p->vFunNodes);
  Vec_IntFreeP(&p->vTemp);
  Vec_IntFreeP(&p->vTemp2);
  Vec_IntFreeP(&p->vUsedBins);
  if (p->pPerms != (int *)0x0) {
    free(p->pPerms);
    p->pPerms = (int *)0x0;
  }
  if (p->pComps != (int *)0x0) {
    free(p->pComps);
    p->pComps = (int *)0x0;
  }
  if (p->pPres != (word *)0x0) {
    free(p->pPres);
    p->pPres = (word *)0x0;
  }
  if (p->pBins != (uint *)0x0) {
    free(p->pBins);
    p->pBins = (uint *)0x0;
  }
  if (p != (Dtt_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Dtt_ManFree( Dtt_Man_t * p )
{
    Vec_IntFreeP( &p->vVisited );
    ABC_FREE( p->pTable );
    ABC_FREE( p->pNodes );
    ABC_FREE( p->pTimes );
    ABC_FREE( p->pVisited );
    Vec_IntFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vConfigs );
    Vec_IntFreeP( &p->vClasses );
    Vec_IntFreeP( &p->vTruthNpns );
    Vec_WecFreeP( &p->vFunNodes );
    Vec_IntFreeP( &p->vTemp );
    Vec_IntFreeP( &p->vTemp2 );
    Vec_IntFreeP( &p->vUsedBins );
    ABC_FREE( p->pPerms );
    ABC_FREE( p->pComps );
    ABC_FREE( p->pPres );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}